

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_encode_file(char *filename,uchar *image,uint w,uint h,LodePNGColorType colortype,
                        uint bitdepth)

{
  uint uVar1;
  uchar *buffer;
  size_t buffersize;
  uchar *local_20;
  size_t local_18;
  
  uVar1 = lodepng_encode_memory(&local_20,&local_18,image,w,h,colortype,bitdepth);
  if (uVar1 == 0) {
    uVar1 = lodepng_save_file(local_20,local_18,filename);
  }
  free(local_20);
  return uVar1;
}

Assistant:

unsigned lodepng_encode_file(const char* filename, const unsigned char* image, unsigned w, unsigned h,
                             LodePNGColorType colortype, unsigned bitdepth) {
  unsigned char* buffer;
  size_t buffersize;
  unsigned error = lodepng_encode_memory(&buffer, &buffersize, image, w, h, colortype, bitdepth);
  if(!error) error = lodepng_save_file(buffer, buffersize, filename);
  lodepng_free(buffer);
  return error;
}